

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL4RSrcDstInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint in_EAX;
  DecodeStatus DVar1;
  uint uVar2;
  uint RegNo;
  uint unaff_R12D;
  uint unaff_R15D;
  void *Decoder_00;
  
  uVar2 = Insn >> 6 & 0x1f;
  Decoder_00 = (void *)(ulong)uVar2;
  if (uVar2 < 0x1b) {
    in_EAX = (Insn >> 4 & 3) + (uVar2 % 3) * 4;
    unaff_R15D = (Insn >> 2 & 3) + (uVar2 / 3 + (uVar2 / 9) * -3) * 4;
    unaff_R12D = (Insn & 3) + (uVar2 / 9) * 4;
    DVar1 = MCDisassembler_Success;
  }
  else {
    DVar1 = MCDisassembler_Fail;
  }
  RegNo = Insn >> 0x10 & 0xf;
  if (uVar2 < 0x1b) {
    DecodeGRRegsRegisterClass(Inst,in_EAX,Address,Decoder_00);
    DVar1 = DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder_00);
  }
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,unaff_R15D,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,unaff_R12D,Address,Decoder_00);
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL4RSrcDstInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	unsigned Op4 = fieldFromInstruction_4(Insn, 16, 4);
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		S = DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	}

	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}
	return S;
}